

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O2

void __thiscall DebugStream::~DebugStream(DebugStream *this)

{
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  pthread_mutex_unlock((pthread_mutex_t *)&s_debugSection);
  return;
}

Assistant:

~DebugStream()
    {
#if COLOR_DEBUG
        std::cout << "\033[0m" << std::endl;
#else
        std::cout << std::endl;
#endif
        s_debugSection.unlock();
    }